

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineComputer.cxx
# Opt level: O3

string * __thiscall
cmLinkLineComputer::ComputeLinkLibraries
          (string *__return_storage_ptr__,cmLinkLineComputer *this,cmComputeLinkInformation *cli,
          string *stdLibString)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  ostream *poVar3;
  string rpath_link;
  ostringstream fout;
  string local_1e0;
  string local_1c0;
  undefined1 local_1a0 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  ComputeRPath_abi_cxx11_(&local_1e0,this,cli);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  paVar1 = &local_1e0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  ComputeLinkLibs_abi_cxx11_(&local_1e0,this,cli);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  cmComputeLinkInformation::GetRPathLinkString_abi_cxx11_(&local_1e0,cli);
  sVar2 = (cli->RPathLinkFlag)._M_string_length;
  if ((sVar2 != 0) && (local_1e0._M_string_length != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,(cli->RPathLinkFlag)._M_dataplus._M_p,sVar2);
    cmOutputConverter::EscapeForShell
              (&local_1c0,this->OutputConverter,&local_1e0,(bool)(this->ForResponse ^ 1),false,false
              );
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0," ",1);
  }
  if (stdLibString->_M_string_length != 0) {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a0,(stdLibString->_M_dataplus)._M_p,
                        stdLibString->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  }
  std::__cxx11::stringbuf::str();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string cmLinkLineComputer::ComputeLinkLibraries(
  cmComputeLinkInformation& cli, std::string const& stdLibString)
{
  std::ostringstream fout;
  fout << this->ComputeRPath(cli);

  // Write the library flags to the build rule.
  fout << this->ComputeLinkLibs(cli);

  // Add the linker runtime search path if any.
  std::string rpath_link = cli.GetRPathLinkString();
  if (!cli.GetRPathLinkFlag().empty() && !rpath_link.empty()) {
    fout << cli.GetRPathLinkFlag();
    fout << this->OutputConverter->EscapeForShell(rpath_link,
                                                  !this->ForResponse);
    fout << " ";
  }

  if (!stdLibString.empty()) {
    fout << stdLibString << " ";
  }

  return fout.str();
}